

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O3

int write_normal_fill_chunk(output_file *out,uint len,uint32_t fill_val)

{
  uint32_t *puVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  if (3 < out->block_size) {
    puVar1 = out->fill_buf;
    uVar3 = 0;
    do {
      puVar1[uVar3] = fill_val;
      uVar3 = uVar3 + 1;
    } while (uVar3 < out->block_size >> 2);
  }
  iVar2 = 0;
  if (len != 0) {
    do {
      uVar4 = out->block_size;
      if (len <= out->block_size) {
        uVar4 = len;
      }
      iVar2 = (*out->ops->write)(out,out->fill_buf,(size_t)uVar4);
    } while ((-1 < iVar2) && (len = len - uVar4, iVar2 = 0, len != 0));
  }
  return iVar2;
}

Assistant:

static int write_normal_fill_chunk(struct output_file* out, unsigned int len, uint32_t fill_val) {
  int ret;
  unsigned int i;
  unsigned int write_len;

  /* Initialize fill_buf with the fill_val */
  for (i = 0; i < out->block_size / sizeof(uint32_t); i++) {
    out->fill_buf[i] = fill_val;
  }

  while (len) {
    write_len = std::min(len, out->block_size);
    ret = out->ops->write(out, out->fill_buf, write_len);
    if (ret < 0) {
      return ret;
    }

    len -= write_len;
  }

  return 0;
}